

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this,
          RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *other)

{
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *other_local;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }